

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int check_ascii_string(char *message,size_t max)

{
  ulong local_28;
  size_t index;
  size_t max_local;
  char *message_local;
  
  if (message == (char *)0x0) {
    message_local._4_4_ = -2;
  }
  else {
    for (local_28 = 0; message[local_28] != '\0'; local_28 = local_28 + 1) {
      if (((message[local_28] < ' ') || (message[local_28] == '\x7f')) || (max < local_28)) {
        return -2;
      }
    }
    message_local._4_4_ = 0;
  }
  return message_local._4_4_;
}

Assistant:

static int check_ascii_string(const char *message, size_t max)
{
    size_t index;

    if (!message)
        return WALLY_EINVAL;

    for (index = 0; message[index] != '\0'; ++index)
        if ((message[index] < 0x20) || (message[index] == 0x7f) || (index > max))
            return WALLY_EINVAL;

    return WALLY_OK;
}